

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void Scrollbar(ImGuiWindow *window,bool horizontal)

{
  undefined8 *puVar1;
  bool bVar2;
  ImGuiID IVar3;
  ImDrawList *this;
  bool bVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined8 uVar7;
  ImGuiContext *pIVar8;
  ImGuiContext *pIVar9;
  ImU32 IVar10;
  float *pfVar11;
  char cVar12;
  ulong uVar13;
  undefined7 in_register_00000031;
  char *str;
  int iVar14;
  long lVar15;
  uint uVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  bool hovered;
  bool held;
  bool local_e1;
  float local_e0;
  float local_dc;
  bool local_d5;
  ImRect local_d4;
  float local_c4;
  float local_c0;
  ImGuiID local_bc;
  undefined1 local_b8 [16];
  ImGuiContext *local_a8;
  float local_9c;
  ulong local_98;
  undefined8 uStack_90;
  ulong local_88;
  undefined8 uStack_80;
  undefined1 local_78 [16];
  ImVec4 local_68;
  ImVec2 local_50;
  undefined1 local_48 [16];
  
  pIVar8 = GImGui;
  local_78._8_8_ = local_78._0_8_;
  uVar13 = CONCAT71(in_register_00000031,horizontal) & 0xffffffff;
  str = "#SCROLLY";
  if ((int)CONCAT71(in_register_00000031,horizontal) != 0) {
    str = "#SCROLLX";
  }
  local_bc = ImGuiWindow::GetID(window,str,(char *)0x0);
  bVar2 = (&window->ScrollbarX)[uVar13];
  fVar21 = 0.0;
  if (bVar2 == true) {
    fVar21 = (pIVar8->Style).ScrollbarSize;
  }
  local_d4.Min.x = (window->Pos).x;
  local_d4.Min.y = (window->Pos).y;
  local_d4.Max.x = (window->Size).x + local_d4.Min.x;
  local_d4.Max.y = (window->Size).y + local_d4.Min.y;
  fVar17 = window->BorderSize;
  cVar12 = (char)uVar13;
  if (cVar12 == '\0') {
    local_d4.Min.x = local_d4.Max.x - (pIVar8->Style).ScrollbarSize;
    local_d4.Min.y = local_d4.Min.y + fVar17;
    local_d4.Max.y = local_d4.Max.y - fVar21;
  }
  else {
    local_d4.Min.x = local_d4.Min.x + fVar17;
    local_d4.Min.y = local_d4.Max.y - (pIVar8->Style).ScrollbarSize;
    local_d4.Max.x = local_d4.Max.x - fVar21;
  }
  local_d4.Max.y = local_d4.Max.y - fVar17;
  local_d4.Max.x = local_d4.Max.x - fVar17;
  if (cVar12 == '\0') {
    fVar18 = 0.0;
    fVar17 = 0.0;
    if ((window->Flags & 1U) == 0) {
      fVar17 = (GImGui->Style).FramePadding.y;
      fVar17 = fVar17 + fVar17 + GImGui->FontBaseSize * window->FontWindowScale;
    }
    if (((uint)window->Flags >> 10 & 1) != 0) {
      fVar18 = (GImGui->Style).FramePadding.y;
      fVar18 = fVar18 + fVar18 + GImGui->FontBaseSize * window->FontWindowScale;
    }
    local_d4.Min.y = fVar17 + fVar18 + local_d4.Min.y;
  }
  uVar16 = window->Flags;
  pfVar11 = &(pIVar8->Style).ChildWindowRounding;
  if ((uVar16 >> 0x14 & 1) == 0) {
    pfVar11 = &(pIVar8->Style).WindowRounding;
  }
  local_b8._0_4_ = *pfVar11;
  local_a8 = pIVar8;
  local_98 = CONCAT44(local_98._4_4_,fVar21);
  if (cVar12 == '\0') {
    local_78._0_8_ = &(window->Size).y;
    iVar14 = (~uVar16 >> 9 & -(uVar16 & 1) & 2) + (uint)(bVar2 ^ 1) * 4;
    local_88 = 0x38;
  }
  else {
    local_78._0_8_ = &window->Size;
    iVar14 = (uint)(bVar2 ^ 1) * 4 + 8;
    local_88 = 0x34;
  }
  this = window->DrawList;
  local_68.x = (GImGui->Style).Colors[0xe].x;
  local_68.y = (GImGui->Style).Colors[0xe].y;
  uVar5 = (GImGui->Style).Colors[0xe].z;
  uVar6 = (GImGui->Style).Colors[0xe].w;
  local_68.w = (GImGui->Style).Alpha * (float)uVar6;
  local_68.z = (float)uVar5;
  IVar10 = ImGui::ColorConvertFloat4ToU32(&local_68);
  ImDrawList::AddRectFilled(this,&local_d4.Min,&local_d4.Max,IVar10,(float)local_b8._0_4_,iVar14);
  fVar17 = ((local_d4.Max.x - local_d4.Min.x) + -2.0) * 0.5;
  fVar21 = 0.0;
  if (-1 < (int)fVar17) {
    fVar17 = (float)(int)fVar17;
    fVar21 = 3.0;
    if (fVar17 <= 3.0) {
      fVar21 = fVar17;
    }
  }
  fVar18 = ((local_d4.Max.y - local_d4.Min.y) + -2.0) * 0.5;
  fVar17 = 0.0;
  if ((-1 < (int)fVar18) && (fVar18 = (float)(int)fVar18, fVar17 = 3.0, fVar18 <= 3.0)) {
    fVar17 = fVar18;
  }
  local_dc = local_d4.Min.x + fVar21;
  local_e0 = local_d4.Min.y + fVar17;
  local_d4.Max.x = local_d4.Max.x - fVar21;
  local_d4.Max.y = local_d4.Max.y - fVar17;
  if (cVar12 == '\0') {
    local_9c = local_d4.Max.y - local_e0;
  }
  else {
    local_9c = local_d4.Max.x - local_dc;
  }
  local_b8 = ZEXT416((uint)(&(window->Scroll).x)[!horizontal]);
  local_98._0_4_ = *(float *)local_78._0_8_ - (float)local_98;
  local_48 = ZEXT416((uint)(float)local_98);
  fVar21 = *(float *)((long)&window->Name + local_88);
  local_78 = ZEXT416((uint)fVar21);
  local_98._0_4_ =
       (float)local_98 /
       (float)(~-(uint)((float)local_98 <= fVar21) & (uint)(float)local_98 |
              -(uint)((float)local_98 <= fVar21) & (uint)fVar21);
  fVar21 = 1.0;
  if ((float)local_98 <= 1.0) {
    fVar21 = (float)local_98;
  }
  fVar17 = (float)(~-(uint)((float)local_98 < 0.0) & (uint)fVar21) * local_9c;
  fVar21 = (local_a8->Style).GrabMinSize;
  uVar16 = -(uint)(fVar21 <= fVar17);
  fVar21 = (float)(~uVar16 & (uint)fVar21 | (uint)fVar17 & uVar16);
  if (local_9c <= fVar21) {
    fVar21 = local_9c;
  }
  local_98 = (ulong)(uint)fVar21;
  uStack_90 = 0;
  local_88 = (ulong)(uint)(fVar21 / local_9c);
  uStack_80 = 0;
  local_d5 = false;
  local_e1 = false;
  IVar3 = local_a8->ActiveId;
  local_d4.Min.x = local_dc;
  local_d4.Min.y = local_e0;
  local_c4 = local_d4.Max.y;
  local_c0 = local_d4.Max.x;
  ImGui::ButtonBehavior(&local_d4,local_bc,&local_e1,&local_d5,0);
  pIVar9 = local_a8;
  pIVar8 = GImGui;
  fVar21 = 1.0;
  if (1.0 <= (float)local_78._0_4_ - (float)local_48._0_4_) {
    fVar21 = (float)local_78._0_4_ - (float)local_48._0_4_;
  }
  fVar18 = (float)local_b8._0_4_ / fVar21;
  fVar17 = 1.0;
  if (fVar18 <= 1.0) {
    fVar17 = fVar18;
  }
  fVar17 = ((float)(~-(uint)(fVar18 < 0.0) & (uint)fVar17) * (local_9c - (float)local_98)) /
           local_9c;
  if (1.0 <= (float)local_88 || local_d5 != true) {
    local_b8 = ZEXT416((uint)fVar17);
  }
  else {
    fVar18 = local_dc;
    if (cVar12 == '\0') {
      fVar18 = local_e0;
    }
    lVar15 = (ulong)!horizontal * 4;
    fVar19 = (*(float *)((local_a8->IO).MouseDown + lVar15 + -8) - fVar18) / local_9c;
    fVar18 = 1.0;
    if (fVar19 <= 1.0) {
      fVar18 = fVar19;
    }
    fVar20 = 0.0;
    fVar18 = (float)(~-(uint)(fVar19 < 0.0) & (uint)fVar18);
    GImGui->HoveredId = local_bc;
    pIVar8->HoveredIdAllowOverlap = false;
    if (IVar3 == local_bc) {
      bVar4 = false;
    }
    else {
      bVar2 = (float)local_88 + fVar17 < fVar18;
      bVar4 = fVar18 < fVar17 || bVar2;
      if (fVar18 >= fVar17 && !bVar2) {
        fVar20 = (float)local_88 * -0.5 + (fVar18 - fVar17);
      }
      *(float *)(local_a8->Tooltip + lVar15 + -8) = fVar20;
    }
    fVar19 = ((fVar18 - *(float *)(local_a8->Tooltip + lVar15 + -8)) - (float)local_88 * 0.5) /
             (1.0 - (float)local_88);
    fVar17 = 1.0;
    if (fVar19 <= 1.0) {
      fVar17 = fVar19;
    }
    fVar17 = (float)(int)((float)(~-(uint)(fVar19 < 0.0) & (uint)fVar17) * fVar21 + 0.5);
    if (cVar12 == '\0') {
      (window->Scroll).y = fVar17;
    }
    else {
      (window->Scroll).x = fVar17;
    }
    fVar17 = fVar17 / fVar21;
    fVar21 = 1.0;
    if (fVar17 <= 1.0) {
      fVar21 = fVar17;
    }
    fVar21 = ((local_9c - (float)local_98) * (float)(~-(uint)(fVar17 < 0.0) & (uint)fVar21)) /
             local_9c;
    local_b8 = ZEXT416((uint)fVar21);
    if (bVar4) {
      *(float *)(local_a8->Tooltip + lVar15 + -8) = -(float)local_88 * 0.5 + (fVar18 - fVar21);
    }
  }
  iVar14 = 0x11;
  if (local_d5 == false) {
    iVar14 = (local_e1 & 1) + 0xf;
  }
  puVar1 = (undefined8 *)((long)&(GImGui->Style).Colors[0].x + (ulong)(uint)(iVar14 << 4));
  local_68._0_8_ = *puVar1;
  uVar7 = puVar1[1];
  local_68.w = (float)((ulong)uVar7 >> 0x20);
  local_68.z = (float)uVar7;
  local_68.w = (GImGui->Style).Alpha * local_68.w;
  IVar10 = ImGui::ColorConvertFloat4ToU32(&local_68);
  if (cVar12 == '\0') {
    local_68.y = (local_c4 - local_e0) * (float)local_b8._0_4_ + local_e0;
    local_68.x = local_dc;
    local_50.y = (float)local_98 + local_68.y;
    local_50.x = local_c0;
  }
  else {
    local_68.x = (local_c0 - local_dc) * (float)local_b8._0_4_ + local_dc;
    local_68.y = local_e0;
    local_50.x = (float)local_98 + local_68.x;
    local_50.y = local_c4;
  }
  ImDrawList::AddRectFilled
            (window->DrawList,(ImVec2 *)&local_68,&local_50,IVar10,(pIVar9->Style).ScrollbarRounding
             ,0xf);
  return;
}

Assistant:

static void Scrollbar(ImGuiWindow* window, bool horizontal)
{
    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;
    const ImGuiID id = window->GetID(horizontal ? "#SCROLLX" : "#SCROLLY");

    // Render background
    bool other_scrollbar = (horizontal ? window->ScrollbarY : window->ScrollbarX);
    float other_scrollbar_size_w = other_scrollbar ? style.ScrollbarSize : 0.0f;
    const ImRect window_rect = window->Rect();
    const float border_size = window->BorderSize;
    ImRect bb = horizontal
        ? ImRect(window->Pos.x + border_size, window_rect.Max.y - style.ScrollbarSize, window_rect.Max.x - other_scrollbar_size_w - border_size, window_rect.Max.y - border_size)
        : ImRect(window_rect.Max.x - style.ScrollbarSize, window->Pos.y + border_size, window_rect.Max.x - border_size, window_rect.Max.y - other_scrollbar_size_w - border_size);
    if (!horizontal)
        bb.Min.y += window->TitleBarHeight() + ((window->Flags & ImGuiWindowFlags_MenuBar) ? window->MenuBarHeight() : 0.0f);

    float window_rounding = (window->Flags & ImGuiWindowFlags_ChildWindow) ? style.ChildWindowRounding : style.WindowRounding;
    int window_rounding_corners;
    if (horizontal)
        window_rounding_corners = 8 | (other_scrollbar ? 0 : 4);
    else
        window_rounding_corners = (((window->Flags & ImGuiWindowFlags_NoTitleBar) && !(window->Flags & ImGuiWindowFlags_MenuBar)) ? 2 : 0) | (other_scrollbar ? 0 : 4);
    window->DrawList->AddRectFilled(bb.Min, bb.Max, ImGui::GetColorU32(ImGuiCol_ScrollbarBg), window_rounding, window_rounding_corners);
    bb.Reduce(ImVec2(ImClamp((float)(int)((bb.Max.x - bb.Min.x - 2.0f) * 0.5f), 0.0f, 3.0f), ImClamp((float)(int)((bb.Max.y - bb.Min.y - 2.0f) * 0.5f), 0.0f, 3.0f)));

    // V denote the main axis of the scrollbar
    float scrollbar_size_v = horizontal ? bb.GetWidth() : bb.GetHeight();
    float scroll_v = horizontal ? window->Scroll.x : window->Scroll.y;
    float win_size_avail_v = (horizontal ? window->Size.x : window->Size.y) - other_scrollbar_size_w;
    float win_size_contents_v = horizontal ? window->SizeContents.x : window->SizeContents.y;

    // The grabable box size generally represent the amount visible (vs the total scrollable amount)
    // But we maintain a minimum size in pixel to allow for the user to still aim inside.
    const float grab_h_pixels = ImMin(ImMax(scrollbar_size_v * ImSaturate(win_size_avail_v / ImMax(win_size_contents_v, win_size_avail_v)), style.GrabMinSize), scrollbar_size_v);
    const float grab_h_norm = grab_h_pixels / scrollbar_size_v;

    // Handle input right away. None of the code of Begin() is relying on scrolling position before calling Scrollbar().
    bool held = false;
    bool hovered = false;
    const bool previously_held = (g.ActiveId == id);
    ImGui::ButtonBehavior(bb, id, &hovered, &held);

    float scroll_max = ImMax(1.0f, win_size_contents_v - win_size_avail_v);
    float scroll_ratio = ImSaturate(scroll_v / scroll_max);
    float grab_v_norm = scroll_ratio * (scrollbar_size_v - grab_h_pixels) / scrollbar_size_v;
    if (held && grab_h_norm < 1.0f)
    {
        float scrollbar_pos_v = horizontal ? bb.Min.x : bb.Min.y;
        float mouse_pos_v = horizontal ? g.IO.MousePos.x : g.IO.MousePos.y;
        float* click_delta_to_grab_center_v = horizontal ? &g.ScrollbarClickDeltaToGrabCenter.x : &g.ScrollbarClickDeltaToGrabCenter.y;

        // Click position in scrollbar normalized space (0.0f->1.0f)
        const float clicked_v_norm = ImSaturate((mouse_pos_v - scrollbar_pos_v) / scrollbar_size_v);
        ImGui::SetHoveredID(id);

        bool seek_absolute = false;
        if (!previously_held)
        {
            // On initial click calculate the distance between mouse and the center of the grab
            if (clicked_v_norm >= grab_v_norm && clicked_v_norm <= grab_v_norm + grab_h_norm)
            {
                *click_delta_to_grab_center_v = clicked_v_norm - grab_v_norm - grab_h_norm*0.5f;
            }
            else
            {
                seek_absolute = true;
                *click_delta_to_grab_center_v = 0.0f;
            }
        }

        // Apply scroll
        // It is ok to modify Scroll here because we are being called in Begin() after the calculation of SizeContents and before setting up our starting position
        const float scroll_v_norm = ImSaturate((clicked_v_norm - *click_delta_to_grab_center_v - grab_h_norm*0.5f) / (1.0f - grab_h_norm));
        scroll_v = (float)(int)(0.5f + scroll_v_norm * scroll_max);//(win_size_contents_v - win_size_v));
        if (horizontal)
            window->Scroll.x = scroll_v;
        else
            window->Scroll.y = scroll_v;

        // Update values for rendering
        scroll_ratio = ImSaturate(scroll_v / scroll_max);
        grab_v_norm = scroll_ratio * (scrollbar_size_v - grab_h_pixels) / scrollbar_size_v;

        // Update distance to grab now that we have seeked and saturated
        if (seek_absolute)
            *click_delta_to_grab_center_v = clicked_v_norm - grab_v_norm - grab_h_norm*0.5f;
    }

    // Render
    const ImU32 grab_col = ImGui::GetColorU32(held ? ImGuiCol_ScrollbarGrabActive : hovered ? ImGuiCol_ScrollbarGrabHovered : ImGuiCol_ScrollbarGrab);
    if (horizontal)
        window->DrawList->AddRectFilled(ImVec2(ImLerp(bb.Min.x, bb.Max.x, grab_v_norm), bb.Min.y), ImVec2(ImLerp(bb.Min.x, bb.Max.x, grab_v_norm) + grab_h_pixels, bb.Max.y), grab_col, style.ScrollbarRounding);
    else
        window->DrawList->AddRectFilled(ImVec2(bb.Min.x, ImLerp(bb.Min.y, bb.Max.y, grab_v_norm)), ImVec2(bb.Max.x, ImLerp(bb.Min.y, bb.Max.y, grab_v_norm) + grab_h_pixels), grab_col, style.ScrollbarRounding);
}